

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::AddMouseButtonEvent(ImGuiIO *this,int mouse_button,bool down)

{
  ImGuiInputEvent e;
  ImGuiContext *g;
  ImGuiInputEvent *in_stack_ffffffffffffffc8;
  
  ImGuiInputEvent::ImGuiInputEvent((ImGuiInputEvent *)0x1147db);
  ImVector<ImGuiInputEvent>::push_back
            ((ImVector<ImGuiInputEvent> *)0x100000003,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void ImGuiIO::AddMouseButtonEvent(int mouse_button, bool down)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    IM_ASSERT(mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT);

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MouseButton;
    e.Source = ImGuiInputSource_Mouse;
    e.MouseButton.Button = mouse_button;
    e.MouseButton.Down = down;
    g.InputEventsQueue.push_back(e);
}